

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O2

int __thiscall OpenMD::ElementsTable::GetAtomicNum(ElementsTable *this,char *identifier,int *iso)

{
  Element *pEVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  pointer ppEVar7;
  char *local_50 [4];
  
  if (this->init_ == false) {
    Init(this);
  }
  ppEVar7 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar5 = (this->elements_).
            super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppEVar6 = ppEVar7;
  do {
    if (ppEVar6 == ppEVar5) {
      sVar4 = strlen(identifier);
      uVar2 = 5;
      if (5 < (int)sVar4) {
        uVar2 = sVar4;
      }
      while( true ) {
        if (ppEVar7 == ppEVar5) {
          iVar3 = strcasecmp(identifier,"D");
          if ((iVar3 == 0) || (iVar3 = strcasecmp(identifier,"Deuterium"), iVar3 == 0)) {
            *iso = 2;
          }
          else {
            iVar3 = strcasecmp(identifier,"T");
            if ((iVar3 == 0) || (iVar3 = strcasecmp(identifier,"Tritium"), iVar3 == 0)) {
              *iso = 3;
            }
            else {
              iVar3 = strcasecmp(identifier,"Hl");
              if (iVar3 != 0) {
                *iso = 0;
                return 0;
              }
              snprintf(painCave.errMsg,2000,
                       "ElementsTable warning.\n\tCannot understand the element label %s\n\tGuessing it\'s hydrogen\n"
                       ,identifier);
              painCave.isFatal = 0;
              painCave.severity = 2;
              simError();
            }
          }
          return 1;
        }
        std::__cxx11::string::string((string *)local_50,(string *)&(*ppEVar7)->name_);
        iVar3 = strncasecmp(identifier,local_50[0],uVar2 & 0xffffffff);
        std::__cxx11::string::~string((string *)local_50);
        if (iVar3 == 0) break;
        ppEVar7 = ppEVar7 + 1;
        ppEVar5 = (this->elements_).
                  super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      return (*ppEVar7)->num_;
    }
    pEVar1 = *ppEVar6;
    iVar3 = strncasecmp(identifier,(pEVar1->symbol_)._M_dataplus._M_p,3);
    ppEVar6 = ppEVar6 + 1;
  } while (iVar3 != 0);
  return pEVar1->num_;
}

Assistant:

int ElementsTable::GetAtomicNum(const char* identifier, int& iso) {
    if (!init_) Init();

    // Compare to symbol
    std::vector<Element*>::iterator i;
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (!strncasecmp(identifier, (*i)->GetSymbol(), 3))
        return ((*i)->GetAtomicNum());

    // Compare to IUPAC name (an abbreviated name will also work if 5
    // letters or more)
    int numCharsToTest = std::max<int>(strlen(identifier), 5);
    for (i = elements_.begin(); i != elements_.end(); ++i)
      if (strncasecmp(identifier, (*i)->GetName().c_str(), numCharsToTest) == 0)
        return ((*i)->GetAtomicNum());

    if (strcasecmp(identifier, "D") == 0 ||
        (strcasecmp(identifier, "Deuterium") == 0)) {
      iso = 2;
      return (1);
    } else if (strcasecmp(identifier, "T") == 0 ||
               (strcasecmp(identifier, "Tritium") == 0)) {
      iso = 3;
      return (1);
    } else if (strcasecmp(identifier, "Hl") == 0) {
      // ligand hydrogen -- found in some CIF PR#3048959.
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable warning.\n"
               "\tCannot understand the element label %s\n"
               "\tGuessing it's hydrogen\n",
               identifier);
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_WARNING;
      simError();
      return (1);
    } else
      iso = 0;

    if (identifier[0] != '*') {
      // Quiet down the error messages for now:
      // snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //          "ElementsTable warning.\n"
      //          "\tCannot understand the element label %s\n", identifier);
      // painCave.isFatal = 0;
      // painCave.severity = OPENMD_WARNING;
      // simError();
    }
    return (0);
  }